

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O1

void __thiscall so_5::environment_t::impl__run_stats_controller_and_go_further(environment_t *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 *local_90 [2];
  undefined1 local_80 [80];
  
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"run_stats_controller","");
  impl__run_layers_and_go_further(this);
  iVar1 = (*((((this->m_impl)._M_t.
               super___uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_so_5::environment_t::internals_t_*,_std::default_delete<so_5::environment_t::internals_t>_>
               .super__Head_base<0UL,_so_5::environment_t::internals_t_*,_false>._M_head_impl)->
             m_infrastructure)._M_t.
             super___uniq_ptr_impl<so_5::environment_infrastructure_t,_void_(*)(so_5::environment_infrastructure_t_*)>
             ._M_t.
             super__Tuple_impl<0UL,_so_5::environment_infrastructure_t_*,_void_(*)(so_5::environment_infrastructure_t_*)>
             .super__Head_base<0UL,_so_5::environment_infrastructure_t_*,_false>._M_head_impl)->
            _vptr_environment_infrastructure_t[10])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))((long *)CONCAT44(extraout_var,iVar1));
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  return;
}

Assistant:

void
environment_t::impl__run_stats_controller_and_go_further()
{
	impl::run_stage(
			"run_stats_controller",
			[this] {
				/* there is no need to turn_on controller automatically */
			},
			[this] { m_impl->m_infrastructure->stats_controller().turn_off(); },
			[this] { impl__run_layers_and_go_further(); } );
}